

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::CNegativeGshArray<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeGshArray<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLsizei width;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  _Alloc_hider _Var1;
  pointer pVVar2;
  undefined1 auVar3 [8];
  int i;
  GLuint GVar4;
  GLenum GVar5;
  int iVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer __dest;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  CColorArray coords;
  CColorArray bufferTest;
  DrawArraysIndirectCommand indirectArrays;
  CColorArray bufferRef;
  DIResult result;
  allocator_type local_519;
  string local_518;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_4f8;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  value_type local_4c8;
  undefined1 local_4b8 [8];
  pointer local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8 [23];
  undefined1 local_338 [8];
  _func_int **local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [23];
  long local_1b8;
  DILogger local_1b0;
  
  local_338 = (undefined1  [8])local_328;
  local_4b8 = (undefined1  [8])0x44;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_338,(ulong)local_4b8);
  auVar3 = local_4b8;
  local_328[0]._M_allocated_capacity = local_4b8;
  local_338 = (undefined1  [8])paVar8;
  memcpy(paVar8,"#version 150\nin vec4 coords;\nvoid main() {\n  gl_Position = coords;\n}",0x44);
  local_330 = (_func_int **)auVar3;
  paVar8->_M_local_buf[(long)auVar3] = '\0';
  local_518._M_dataplus._M_p = (pointer)0xc8;
  local_4b8 = (undefined1  [8])local_4a8;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)std::__cxx11::string::_M_create((ulong *)local_4b8,(ulong)&local_518);
  _Var1._M_p = local_518._M_dataplus._M_p;
  local_4a8[0]._M_allocated_capacity = local_518._M_dataplus._M_p;
  local_4b8 = (undefined1  [8])paVar8;
  memcpy(paVar8,
         "#version 150\nlayout(triangles) in;\nlayout(triangle_strip, max_vertices = 10) out;\nvoid main() {\n for (int i=0; i<gl_in.length(); ++i) {\n     gl_Position = gl_in[i].gl_Position;\n     EmitVertex();\n }\n}"
         ,200);
  local_4b0 = (pointer)_Var1._M_p;
  paVar8->_M_local_buf[(long)_Var1._M_p] = '\0';
  local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_0000005a;
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_518,(ulong)&local_4f8);
  pVVar2 = local_4f8.
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_518.field_2._M_allocated_capacity =
       (size_type)
       local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_518._M_dataplus._M_p = __dest;
  memcpy(__dest,
         "#version 140\nout vec4 outColor;\nvoid main() {\n  outColor = vec4(0.1f, 0.2f, 0.3f, 1.0f);\n}"
         ,0x5a);
  local_518._M_string_length = (size_type)pVVar2;
  __dest[(long)pVVar2] = '\0';
  GVar4 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_338,(string *)local_4b8,
                     &local_518,true);
  this->_program = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,(ulong)(local_518.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_4b8 != (undefined1  [8])local_4a8) {
    operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity + 1);
  }
  if (local_338 != (undefined1  [8])local_328) {
    operator_delete((void *)local_338,local_328[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    lVar9 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    local_518._M_dataplus._M_p = (pointer)0x0;
    local_518._M_string_length = 0;
    local_518.field_2._M_allocated_capacity = 0;
    DrawIndirectBase::PrimitiveGen(&this->super_DrawIndirectBase,4,8,8,(CColorArray *)&local_518);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,local_518._M_string_length - (long)local_518._M_dataplus._M_p,
               local_518._M_dataplus._M_p,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    local_4d8 = (undefined4)(local_518._M_string_length - (long)local_518._M_dataplus._M_p >> 4);
    uStack_4d4 = 1;
    uStack_4d0 = 0;
    uStack_4cc = 0x908;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x10,&local_4d8,0x88e4);
    local_338 = (undefined1  [8])((ulong)local_338 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
    local_1b8 = 0;
    glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
    GVar5 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar5 != 0x502) {
      local_1b8 = -1;
      local_4b8 = (undefined1  [8])((ulong)local_4b8 & 0xffffffffffffff00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b0);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)local_4b8,
                 (char (*) [70])
                 "Invalid error code returned by a driver for GL_INVALID_OPERATION type");
      DILogger::~DILogger((DILogger *)local_4b8);
    }
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var,iVar6);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_4b8,
               (long)(iVar6 * *(int *)(CONCAT44(extraout_var_00,iVar7) + 4)),
               (value_type *)&local_4f8,(allocator_type *)&local_4c8);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar6 = *(int *)CONCAT44(extraout_var_01,iVar6);
    iVar7 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = *(int *)(CONCAT44(extraout_var_02,iVar7) + 4);
    lVar9 = 0;
    do {
      local_4c8.m_data[lVar9] = 1.0;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&local_4f8,(long)(iVar6 * iVar7),&local_4c8,&local_519);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(GLsizei *)CONCAT44(extraout_var_03,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_04,iVar6) + 4),0x1908,0x1406,
               local_4f8.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthTest = *(uint *)CONCAT44(extraout_var_05,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    heightTest = *(uint *)(CONCAT44(extraout_var_06,iVar6) + 4);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    widthRef = *(uint *)CONCAT44(extraout_var_07,iVar6);
    iVar6 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,&local_4f8,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_4b8,widthRef,*(uint *)(CONCAT44(extraout_var_08,iVar6) + 4));
    DIResult::sub_result(&local_1b0,(DIResult *)local_338,lVar9);
    DILogger::~DILogger(&local_1b0);
    lVar9 = local_1b8;
    if (local_4f8.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4f8.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4f8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4f8.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_4b8,local_4a8[0]._M_allocated_capacity - (long)local_4b8);
    }
    DILogger::~DILogger((DILogger *)local_338);
    if (local_518._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_518._M_dataplus._M_p,
                      local_518.field_2._M_allocated_capacity - (long)local_518._M_dataplus._M_p);
    }
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(Vsh(), Gsh(), Fsh(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords;
		PrimitiveGen(GL_TRIANGLES, 8, 8, coords);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, sizeof(coords[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand indirectArrays = { 0, 0, 0, 0 };
		indirectArrays.count					 = static_cast<GLuint>(coords.size());
		indirectArrays.primCount				 = 1;
		indirectArrays.first					 = 0;
		indirectArrays.reservedMustBeZero		 = 2312;

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);

		DIResult result;

		glDrawArraysIndirect(GL_POINTS, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			result.error() << "Invalid error code returned by a driver for GL_INVALID_OPERATION type";
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(1.0f));

		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}